

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileTree.cpp
# Opt level: O3

bool __thiscall CASC_FILE_TREE::RebuildTreeMaps(CASC_FILE_TREE *this)

{
  int iVar1;
  size_t MaxItems;
  int iVar2;
  PCASC_MAP p_Var3;
  bool bVar4;
  ulong uVar5;
  LPBYTE pBVar6;
  DWORD DataId;
  int local_2c;
  
  MaxItems = (this->FileTable).m_ItemCountMax;
  local_2c = 0;
  if (this->pNameMap != (PCASC_MAP)0x0) {
    Map_Free(this->pNameMap);
  }
  this->pNameMap = (PCASC_MAP)0x0;
  if (this->pIdMap != (PCASC_MAP)0x0) {
    Map_Free(this->pIdMap);
  }
  this->pIdMap = (PCASC_MAP)0x0;
  p_Var3 = Map_Create(MaxItems,8,0x10);
  this->pNameMap = p_Var3;
  if (p_Var3 == (PCASC_MAP)0x0) {
LAB_0010ede9:
    bVar4 = false;
  }
  else {
    if (this->DataIdOffset != 0) {
      p_Var3 = Map_Create(MaxItems,4,this->DataIdOffset);
      this->pIdMap = p_Var3;
      if (p_Var3 == (PCASC_MAP)0x0) goto LAB_0010ede9;
    }
    bVar4 = true;
    if ((this->FileTable).m_ItemCount != 0) {
      uVar5 = 0;
      do {
        pBVar6 = (this->FileTable).m_pItemArray;
        if (pBVar6 != (LPBYTE)0x0) {
          pBVar6 = pBVar6 + (this->FileTable).m_ItemSize * uVar5;
          if ((this->pNameMap != (PCASC_MAP)0x0) && (*(long *)(pBVar6 + 0x10) != 0)) {
            Map_InsertObject(this->pNameMap,pBVar6,pBVar6 + 0x10);
          }
          iVar2 = local_2c;
          if (this->DataIdOffset != 0) {
            iVar1 = *(int *)(pBVar6 + this->DataIdOffset);
            if (iVar1 != -1) {
              local_2c = iVar1;
            }
            if ((this->pIdMap != (PCASC_MAP)0x0) && (iVar1 != -1 || iVar2 != -1)) {
              Map_InsertObject(this->pIdMap,pBVar6,&local_2c);
            }
          }
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < (this->FileTable).m_ItemCount);
    }
  }
  return bVar4;
}

Assistant:

bool CASC_FILE_TREE::RebuildTreeMaps()
{
    PCASC_FILE_NODE pFileNode;
    size_t nMaxItems = FileTable.ItemCountMax();
    DWORD DataId = 0;

    // Free the map of FullName -> CASC_FILE_NODE
    if(pNameMap != NULL)
        Map_Free(pNameMap);
    pNameMap = NULL;

    // Free the map of DataId -> CASC_FILE_NODE
    if(pIdMap != NULL)
        Map_Free(pIdMap);
    pIdMap = NULL;

    // Create the name map
    pNameMap = Map_Create(nMaxItems, sizeof(ULONGLONG), FIELD_OFFSET(CASC_FILE_NODE, NameHash));
    if(pNameMap == NULL)
        return false;

    // Create the DataId map
    if(DataIdOffset != 0)
    {
        pIdMap = Map_Create(nMaxItems, sizeof(DWORD), DataIdOffset);
        if(pIdMap == NULL)
            return false;
    }

    // Parse all items and insert them to the map
    for(size_t i = 0; i < FileTable.ItemCount(); i++)
    {
        pFileNode = (PCASC_FILE_NODE)FileTable.ItemAt(i);
        if(pFileNode != NULL)
        {
            // Insert the file by name
            if(pNameMap != NULL && pFileNode->NameHash != 0)
                Map_InsertObject(pNameMap, pFileNode, &pFileNode->NameHash);

            // Insert the file by data ID, if supported
            if(DataIdOffset != 0)
            {
                GetExtras(pFileNode, &DataId, NULL, NULL);
                if(pIdMap != NULL && DataId != CASC_INVALID_ID)
                {
                    Map_InsertObject(pIdMap, pFileNode, &DataId);
                }
            }
        }
    }

    return true;
}